

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pboolean p_socket_set_buffer_size(PSocket *socket,PSocketDirection dir,psize size,PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  pboolean pVar4;
  pint optval;
  
  if (socket == (PSocket *)0x0) {
    pVar4 = 0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    pVar4 = 0;
    if (pVar1 != 0) {
      optval = (pint)size;
      pVar4 = 1;
      iVar2 = setsockopt(socket->fd,1,(dir == P_SOCKET_DIRECTION_RCV) + 7,&optval,4);
      if (iVar2 != 0) {
        pVar3 = p_error_get_last_net();
        code = p_error_get_io_from_system(pVar3);
        pVar3 = p_error_get_last_net();
        p_error_set_error_p(error,code,pVar3,
                            "Failed to call setsockopt() on socket to set buffer size");
        pVar4 = 0;
      }
    }
  }
  return pVar4;
}

Assistant:

P_LIB_API pboolean
p_socket_set_buffer_size (const PSocket		*socket,
			  PSocketDirection	dir,
			  psize			size,
			  PError		**error)
{
	pint	optname;
	pint	optval;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	optname = (dir == P_SOCKET_DIRECTION_RCV) ? SO_RCVBUF : SO_SNDBUF;
	optval  = (pint) size;

	if (P_UNLIKELY (setsockopt (socket->fd,
				    SOL_SOCKET,
				    optname,
				    (pconstpointer) &optval,
				    sizeof (optval)) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call setsockopt() on socket to set buffer size");
		return FALSE;
	}

	return TRUE;
}